

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<signed_char,_signed_char>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<signed_char,_signed_char> *this)

{
  int8_t left;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  idx_t iVar4;
  unsigned_long uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  
  bVar11 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (this->all_invalid == false) {
    cVar2 = this->minimum;
    left = this->maximum;
    if (left != cVar2) goto LAB_0106bda0;
  }
  if ((byte)(this->mode - AUTO) < 2) {
    this->total_size = this->total_size + 5;
    return true;
  }
  cVar2 = this->minimum;
  left = this->maximum;
LAB_0106bda0:
  pcVar1 = &this->min_max_diff;
  bVar3 = TrySubtractOperator::Operation<signed_char,signed_char,signed_char>(left,cVar2,pcVar1);
  this->can_do_for = bVar3;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    cVar2 = this->minimum_delta;
    if ((this->maximum_delta == cVar2) && ((this->mode & ~AUTO) != DELTA_FOR)) {
      this->total_size = this->total_size + 6;
      return true;
    }
    if (this->min_max_delta_diff == 0) {
      bVar12 = 0;
    }
    else {
      bVar7 = 0;
      bVar12 = this->min_max_delta_diff;
      do {
        bVar7 = bVar7 + 1;
        bVar3 = 1 < bVar12;
        bVar12 = (char)bVar12 >> 1;
      } while (bVar3);
      bVar12 = 8;
      if (bVar7 < 8) {
        bVar12 = bVar7;
      }
    }
    bVar7 = *pcVar1;
    if (bVar7 == 0) {
      bVar9 = 0;
    }
    else {
      bVar9 = 8;
      if (bVar7 != 0x80) {
        bVar8 = 1;
        bVar7 = (bVar7 ^ (char)bVar7 >> 7) - ((char)bVar7 >> 7);
        do {
          bVar8 = bVar8 + 1;
          bVar3 = 1 < bVar7;
          bVar7 = bVar7 >> 1;
        } while (bVar3);
        bVar9 = 8;
        if (bVar8 < 8) {
          bVar9 = bVar8;
        }
      }
    }
    if ((bVar12 < bVar9) && (this->mode != FOR)) {
      if (this->compression_buffer_idx == 0) {
        iVar4 = this->total_size + 10;
        uVar13 = 0;
      }
      else {
        uVar6 = 0;
        do {
          this->delta_buffer[uVar6] = this->delta_buffer[uVar6] - cVar2;
          uVar6 = uVar6 + 1;
          uVar13 = this->compression_buffer_idx;
        } while (uVar6 < uVar13);
        iVar4 = this->total_size + 10;
        this->total_size = iVar4;
        if ((uVar13 & 0x1f) != 0) {
          uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar13 & 0x1f);
          uVar13 = (uVar13 - uVar5) + 0x20;
          iVar4 = this->total_size;
        }
      }
      this->total_size = (bVar12 * uVar13 >> 3) + iVar4;
      return true;
    }
  }
  if (this->can_do_for == true) {
    if (*pcVar1 == 0) {
      uVar13 = 0;
    }
    else {
      bVar7 = 0;
      bVar12 = *pcVar1;
      do {
        bVar7 = bVar7 + 1;
        bVar3 = 1 < bVar12;
        bVar12 = (char)bVar12 >> 1;
      } while (bVar3);
      bVar12 = 8;
      if (bVar7 < 8) {
        bVar12 = bVar7;
      }
      uVar13 = (ulong)bVar12;
    }
    if (this->compression_buffer_idx == 0) {
      uVar6 = 0;
    }
    else {
      pcVar1 = this->compression_buffer;
      cVar2 = this->minimum;
      uVar10 = 0;
      do {
        pcVar1[uVar10] = pcVar1[uVar10] - cVar2;
        uVar10 = uVar10 + 1;
        uVar6 = this->compression_buffer_idx;
      } while (uVar10 < uVar6);
      if ((uVar6 & 0x1f) != 0) {
        uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar6 & 0x1f);
        uVar6 = (uVar6 - uVar5) + 0x20;
      }
    }
    this->total_size = this->total_size + (uVar6 * uVar13 >> 3) + 9;
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}